

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddApa.c
# Opt level: O2

DdApaNumber
cuddApaCountMintermAux(DdNode *node,int digits,DdApaNumber max,DdApaNumber min,st__table *table)

{
  DdHalfWord DVar1;
  DdNode *node_00;
  DdApaNumber __ptr;
  int iVar2;
  DdApaNumber b;
  DdApaNumber diff;
  DdApaNumber b_00;
  DdNode *node_01;
  DdApaNumber mint;
  DdApaNumber local_50;
  DdApaNumber local_48;
  DdNode *local_40;
  DdNode *local_38;
  
  if (node->index == 0x7fffffff) {
    if (zero == node) {
      max = min;
    }
    if (background == node) {
      return min;
    }
    return max;
  }
  if ((1 < node->ref) && (iVar2 = st__lookup(table,(char *)node,(char **)&local_50), iVar2 != 0)) {
    return local_50;
  }
  node_00 = (node->type).kids.T;
  local_38 = (node->type).kids.E;
  local_48 = cuddApaCountMintermAux(node_00,digits,max,min,table);
  if (local_48 == (DdApaNumber)0x0) {
    return (DdApaNumber)0x0;
  }
  node_01 = (DdNode *)((ulong)local_38 & 0xfffffffffffffffe);
  local_40 = node_00;
  b = cuddApaCountMintermAux(node_01,digits,max,min,table);
  if (b == (DdApaNumber)0x0) {
    DVar1 = local_40->ref;
    b = local_48;
  }
  else {
    diff = Cudd_NewApaNumber(digits);
    local_50 = diff;
    if (diff != (DdApaNumber)0x0) {
      b_00 = b;
      if (((ulong)local_38 & 1) != 0) {
        Cudd_ApaSubtract(digits,max,b,diff);
        b_00 = diff;
      }
      __ptr = local_48;
      Cudd_ApaAdd(digits,local_48,b_00,diff);
      Cudd_ApaShiftRight(digits,0,diff,diff);
      if (local_40->ref == 1) {
        free(__ptr);
      }
      if (node_01->ref == 1) {
        free(b);
      }
      if (node->ref < 2) {
        return local_50;
      }
      iVar2 = st__insert(table,(char *)node,(char *)local_50);
      b = local_50;
      if (iVar2 != -10000) {
        return local_50;
      }
      goto LAB_0064462b;
    }
    if (local_40->ref == 1) {
      free(local_48);
    }
    DVar1 = node_01->ref;
  }
  if (DVar1 != 1) {
    return (DdApaNumber)0x0;
  }
LAB_0064462b:
  free(b);
  return (DdApaNumber)0x0;
}

Assistant:

static DdApaNumber
cuddApaCountMintermAux(
  DdNode * node,
  int  digits,
  DdApaNumber  max,
  DdApaNumber  min,
  st__table * table)
{
    DdNode      *Nt, *Ne;
    DdApaNumber mint, mint1, mint2;
    DdApaDigit  carryout;

    if (cuddIsConstant(node)) {
        if (node == background || node == zero) {
            return(min);
        } else {
            return(max);
        }
    }
    if (node->ref > 1 && st__lookup(table, (const char *)node, (char **)&mint)) {
        return(mint);
    }

    Nt = cuddT(node); Ne = cuddE(node);

    mint1 = cuddApaCountMintermAux(Nt,  digits, max, min, table);
    if (mint1 == NULL) return(NULL);
    mint2 = cuddApaCountMintermAux(Cudd_Regular(Ne), digits, max, min, table);
    if (mint2 == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        return(NULL);
    }
    mint = Cudd_NewApaNumber(digits);
    if (mint == NULL) {
        if (Nt->ref == 1) ABC_FREE(mint1);
        if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);
        return(NULL);
    }
    if (Cudd_IsComplement(Ne)) {
        (void) Cudd_ApaSubtract(digits,max,mint2,mint);
        carryout = Cudd_ApaAdd(digits,mint1,mint,mint);
    } else {
        carryout = Cudd_ApaAdd(digits,mint1,mint2,mint);
    }
    Cudd_ApaShiftRight(digits,carryout,mint,mint);
    /* If the refernce count of a child is 1, its minterm count
    ** hasn't been stored in table.  Therefore, it must be explicitly
    ** freed here. */
    if (Nt->ref == 1) ABC_FREE(mint1);
    if (Cudd_Regular(Ne)->ref == 1) ABC_FREE(mint2);

    if (node->ref > 1) {
        if ( st__insert(table, (char *)node, (char *)mint) == st__OUT_OF_MEM) {
            ABC_FREE(mint);
            return(NULL);
        }
    }
    return(mint);

}